

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinholecamera.hpp
# Opt level: O3

void __thiscall PinholeCamera::PinholeCamera(PinholeCamera *this,Json *conf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  double dVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  Camera::Camera(&this->super_Camera,conf);
  (this->super_Camera)._vptr_Camera = (_func_int **)&PTR_sampleray_0016aca8;
  (this->lefthalf).x = 0.0;
  (this->lefthalf).y = 0.0;
  (this->lefthalf).z = 0.0;
  fVar13 = (this->super_Camera).look_at.z - (this->super_Camera).position.z;
  uVar1 = (this->super_Camera).position.x;
  uVar6 = (this->super_Camera).position.y;
  uVar2 = (this->super_Camera).look_at.x;
  uVar7 = (this->super_Camera).look_at.y;
  fVar17 = (float)uVar2 - (float)uVar1;
  fVar18 = (float)uVar7 - (float)uVar6;
  fVar16 = 1.0 / SQRT(fVar13 * fVar13 + fVar17 * fVar17 + fVar18 * fVar18);
  fVar13 = fVar13 * fVar16;
  fVar17 = fVar16 * fVar17;
  fVar16 = fVar16 * fVar18;
  *(ulong *)&(this->super_Camera).field_0x3c = CONCAT44(fVar16,fVar17);
  *(float *)&this->field_0x44 = fVar13;
  uVar3 = (this->super_Camera).up.x;
  uVar8 = (this->super_Camera).up.y;
  fVar18 = (this->super_Camera).up.z * fVar17 - fVar13 * (float)uVar3;
  uVar4 = (this->super_Camera).up.y;
  uVar9 = (this->super_Camera).up.z;
  fVar21 = (float)uVar3 * fVar16 - (float)uVar4 * fVar17;
  fVar22 = (float)uVar8 * fVar13 - (float)uVar9 * fVar16;
  fVar19 = fVar16 * fVar21 - fVar18 * fVar13;
  fVar20 = fVar13 * fVar22 - fVar21 * fVar17;
  fVar21 = fVar18 * fVar17 - fVar22 * fVar16;
  fVar18 = 1.0 / SQRT(fVar21 * fVar21 + fVar19 * fVar19 + fVar20 * fVar20);
  (this->super_Camera).up.x = fVar18 * fVar19;
  (this->super_Camera).up.y = fVar18 * fVar20;
  (this->super_Camera).up.z = fVar21 * fVar18;
  iVar11 = (this->super_Camera).resy;
  iVar12 = (this->super_Camera).resx;
  dVar14 = tan((double)((this->super_Camera).fov * 0.5));
  fVar18 = (float)(dVar14 * (double)(((float)iVar11 *
                                     SQRT(fVar13 * fVar13 + fVar17 * fVar17 + fVar16 * fVar16)) /
                                    (float)iVar12));
  fVar13 = (this->super_Camera).up.x;
  fVar16 = (this->super_Camera).fov;
  fVar17 = *(float *)&(this->super_Camera).field_0x3c;
  uVar5 = (this->super_Camera).up.y;
  uVar10 = (this->super_Camera).up.z;
  (this->uphalf).x = fVar13 * fVar18;
  (this->uphalf).y = (float)uVar5 * fVar18;
  (this->uphalf).z = (float)uVar10 * fVar18;
  fVar18 = (float)*(undefined8 *)&this->field_0x40;
  fVar19 = (float)((ulong)*(undefined8 *)&this->field_0x40 >> 0x20);
  dVar14 = tan((double)(fVar16 * 0.5));
  fVar16 = (float)dVar14;
  fVar21 = (fVar13 * fVar18 - fVar17 * (float)uVar5) * fVar16;
  fVar18 = fVar16 * (fVar19 * (float)uVar5 - (float)uVar10 * fVar18);
  fVar16 = fVar16 * (fVar17 * (float)uVar10 - fVar13 * fVar19);
  (this->lefthalf).x = fVar18;
  (this->lefthalf).y = fVar16;
  (this->lefthalf).z = fVar21;
  if ((this->super_Camera).mirror == true) {
    uVar15 = CONCAT44(fVar16,fVar18) ^ 0x8000000080000000;
    (this->lefthalf).x = (float)(int)uVar15;
    (this->lefthalf).y = (float)(int)(uVar15 >> 0x20);
    (this->lefthalf).z = -fVar21;
  }
  return;
}

Assistant:

PinholeCamera(const Json& conf): Camera(conf) {
		dir = normalized(look_at - position);
		up = normalized(cross(dir, cross(up, dir)));
		uphalf = norm(dir) * resy / resx * tan(fov/2) * up;
		lefthalf = cross(up, dir) * tan(fov/2);
		if (mirror) lefthalf = -lefthalf;
	}